

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall cmLocalGenerator::AddUnityBuild(cmLocalGenerator *this,cmGeneratorTarget *target)

{
  pointer *this_00;
  cmSourceFile *pcVar1;
  pointer ppcVar2;
  cmGeneratorTarget *pcVar3;
  bool bVar4;
  int iVar5;
  pointer ppcVar6;
  reference config;
  reference ppcVar7;
  size_type sVar8;
  pointer ppVar9;
  reference pvVar10;
  string *psVar11;
  char *pcVar12;
  iterator __first;
  iterator __last;
  back_insert_iterator<std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
  __result;
  cmMakefile *this_01;
  __enable_if_t<is_constructible<value_type,_pair<const_cmSourceFile_*const,_unsigned_long>_&>::value,_pair<iterator,_bool>_>
  _Var13;
  string *local_528;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  cmSourceFile *local_430;
  cmSourceFile *unity;
  UnitySource *file;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_> *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  undefined1 local_3a8 [8];
  string e;
  vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_> local_378;
  string *local_360;
  string *local_358;
  vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_> local_350;
  undefined1 local_338 [8];
  vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_> unity_files;
  undefined1 local_2f8 [8];
  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
  filtered_sources;
  undefined1 local_2d8 [8];
  string lang;
  const_iterator __end1;
  const_iterator __begin1;
  char *local_2a0;
  initializer_list<const_char_*> local_298;
  initializer_list<const_char_*> *local_288;
  initializer_list<const_char_*> *__range1;
  string local_278;
  cmValue local_258;
  cmValue unityMode;
  string local_248;
  cmValue local_228;
  cmValue afterInclude;
  string local_218;
  cmValue local_1f8;
  cmValue beforeInclude;
  size_t unityBatchSize;
  string local_1e0;
  cmValue local_1c0;
  cmValue batchSizeString;
  cmAlphaNum local_188;
  undefined1 local_158 [8];
  string filename_base;
  unsigned_long local_118;
  undefined1 local_110 [8];
  value_type entry;
  _Self local_f8;
  iterator mi;
  cmSourceFile *sf;
  iterator __end2;
  iterator __begin2;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range2;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  size_t ci;
  map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
  index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
  unitySources;
  allocator<char> local_39;
  string local_38;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *this_local;
  
  local_18 = target;
  target_local = (cmGeneratorTarget *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"UNITY_BUILD",&local_39);
  bVar4 = cmGeneratorTarget::GetPropertyAsBool(target,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    std::
    vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
    ::vector((vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
              *)&configs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmMakefile::GetGeneratorConfigs_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&index._M_t._M_impl.super__Rb_tree_header._M_node_count,this->Makefile,
               IncludeEmptyConfig);
    std::
    map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
    ::map((map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
           *)&ci);
    for (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ppcVar2 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
        ppcVar6 = (pointer)std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&index._M_t._M_impl.super__Rb_tree_header._M_node_count),
        ppcVar2 < ppcVar6;
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)sources.
                             super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
                ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range2);
      pcVar3 = local_18;
      config = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&index._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (size_type)
                            sources.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
      cmGeneratorTarget::GetSourceFiles
                (pcVar3,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range2,config)
      ;
      __end2 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                         ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range2);
      sf = (cmSourceFile *)
           std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                     ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range2);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                         *)&sf), bVar4) {
        ppcVar7 = __gnu_cxx::
                  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                  ::operator*(&__end2);
        mi._M_node = (_Base_ptr)*ppcVar7;
        local_f8._M_node =
             (_Base_ptr)
             std::
             map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
             ::find((map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
                     *)&ci,(key_type *)&mi);
        entry.second = (unsigned_long)
                       std::
                       map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
                       ::end((map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
                              *)&ci);
        bVar4 = std::operator==(&local_f8,(_Self *)&entry.second);
        if (bVar4) {
          std::
          vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>
          ::emplace_back<cmSourceFile*&>
                    ((vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>
                      *)&configs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(cmSourceFile **)&mi);
          sVar8 = std::
                  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                  ::size((vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                          *)&configs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_118 = sVar8 - 1;
          std::pair<const_cmSourceFile_*const,_unsigned_long>::
          pair<cmSourceFile_*&,_unsigned_long,_true>
                    ((pair<const_cmSourceFile_*const,_unsigned_long> *)local_110,
                     (cmSourceFile **)&mi,&local_118);
          _Var13 = std::
                   map<cmSourceFile_const*,unsigned_long,std::less<cmSourceFile_const*>,std::allocator<std::pair<cmSourceFile_const*const,unsigned_long>>>
                   ::insert<std::pair<cmSourceFile_const*const,unsigned_long>&>
                             ((map<cmSourceFile_const*,unsigned_long,std::less<cmSourceFile_const*>,std::allocator<std::pair<cmSourceFile_const*const,unsigned_long>>>
                               *)&ci,(pair<const_cmSourceFile_*const,_unsigned_long> *)local_110);
          filename_base.field_2._8_8_ = _Var13.first._M_node;
          local_f8._M_node = (_Base_ptr)filename_base.field_2._8_8_;
        }
        ppVar9 = std::_Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>::
                 operator->(&local_f8);
        pvVar10 = std::
                  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                  ::operator[]((vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                                *)&configs.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,ppVar9->second
                              );
        std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&pvVar10->Configs,
                   (unsigned_long *)
                   &sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        __gnu_cxx::
        __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
        ::operator++(&__end2);
      }
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
                ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range2);
    }
    psVar11 = GetCurrentBinaryDirectory_abi_cxx11_(this);
    cmAlphaNum::cmAlphaNum(&local_188,psVar11);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&batchSizeString,"/CMakeFiles/");
    psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(local_18);
    cmStrCat<std::__cxx11::string,char[12]>
              ((string *)local_158,&local_188,(cmAlphaNum *)&batchSizeString,psVar11,
               (char (*) [12])".dir/Unity/");
    pcVar3 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"UNITY_BUILD_BATCH_SIZE",
               (allocator<char> *)((long)&unityBatchSize + 7));
    local_1c0 = cmGeneratorTarget::GetProperty(pcVar3,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&unityBatchSize + 7));
    bVar4 = cmValue::operator_cast_to_bool(&local_1c0);
    if (bVar4) {
      cmValue::operator->[abi_cxx11_(&local_1c0);
      pcVar12 = (char *)std::__cxx11::string::c_str();
      iVar5 = atoi(pcVar12);
      local_528 = (string *)(long)iVar5;
    }
    else {
      local_528 = (string *)0x0;
    }
    pcVar3 = local_18;
    beforeInclude.Value = local_528;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,"UNITY_BUILD_CODE_BEFORE_INCLUDE",
               (allocator<char> *)((long)&afterInclude.Value + 7));
    local_1f8 = cmGeneratorTarget::GetProperty(pcVar3,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator((allocator<char> *)((long)&afterInclude.Value + 7));
    pcVar3 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"UNITY_BUILD_CODE_AFTER_INCLUDE",
               (allocator<char> *)((long)&unityMode.Value + 7));
    local_228 = cmGeneratorTarget::GetProperty(pcVar3,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator((allocator<char> *)((long)&unityMode.Value + 7));
    pcVar3 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"UNITY_BUILD_MODE",(allocator<char> *)((long)&__range1 + 7));
    local_258 = cmGeneratorTarget::GetProperty(pcVar3,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    __begin1 = (const_iterator)0xd3d47b;
    local_2a0 = "CXX";
    local_298._M_array = (iterator)&__begin1;
    local_298._M_len = 2;
    local_288 = &local_298;
    __end1 = std::initializer_list<const_char_*>::begin(local_288);
    lang.field_2._8_8_ = std::initializer_list<const_char_*>::end(local_288);
    for (; __end1 != (const_iterator)lang.field_2._8_8_; __end1 = __end1 + 1) {
      pcVar12 = *__end1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_2d8,pcVar12,
                 (allocator<char> *)
                 ((long)&filtered_sources.
                         super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&filtered_sources.
                         super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::
      vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
      ::vector((vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                *)local_2f8);
      this_00 = &configs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __first = std::
                vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                ::begin((vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                         *)this_00);
      __last = std::
               vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
               ::end((vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                      *)this_00);
      __result = std::
                 back_inserter<std::vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>>
                           ((vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                             *)local_2f8);
      unity_files.
      super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    copy_if<__gnu_cxx::__normal_iterator<cmLocalGenerator::UnityBatchedSource*,std::vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>>,std::back_insert_iterator<std::vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>>,cmLocalGenerator::AddUnityBuild(cmGeneratorTarget*)::__0>
                              ((__normal_iterator<cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
                                )__first._M_current,
                               (__normal_iterator<cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
                                )__last._M_current,__result,(string *)local_2d8);
      std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
      vector((vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
              *)local_338);
      bVar4 = cmValue::operator_cast_to_bool(&local_258);
      if (bVar4) {
        psVar11 = cmValue::operator*[abi_cxx11_(&local_258);
        bVar4 = std::operator==(psVar11,"BATCH");
        if (bVar4) goto LAB_003e1868;
        bVar4 = cmValue::operator_cast_to_bool(&local_258);
        if (bVar4) {
          psVar11 = cmValue::operator*[abi_cxx11_(&local_258);
          bVar4 = std::operator==(psVar11,"GROUP");
          if (!bVar4) goto LAB_003e1b02;
          e.field_2._8_8_ = local_228.Value;
          AddUnityFilesModeGroup
                    (&local_378,this,local_18,(string *)local_2d8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&index._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                      *)local_2f8,local_1f8,local_228,(string *)local_158);
          std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
          ::operator=((vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                       *)local_338,&local_378);
          std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
          ::~vector(&local_378);
        }
        else {
LAB_003e1b02:
          psVar11 = cmValue::operator*[abi_cxx11_(&local_258);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__range2_1,"Invalid UNITY_BUILD_MODE value of ",psVar11);
          std::operator+(&local_3e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__range2_1," assigned to target ");
          psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(local_18);
          std::operator+(&local_3c8,&local_3e8,psVar11);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3a8,&local_3c8,". Acceptable values are BATCH and GROUP.");
          std::__cxx11::string::~string((string *)&local_3c8);
          std::__cxx11::string::~string((string *)&local_3e8);
          std::__cxx11::string::~string((string *)&__range2_1);
          IssueMessage(this,FATAL_ERROR,(string *)local_3a8);
          std::__cxx11::string::~string((string *)local_3a8);
        }
      }
      else {
LAB_003e1868:
        local_358 = local_1f8.Value;
        local_360 = local_228.Value;
        AddUnityFilesModeAuto
                  (&local_350,this,local_18,(string *)local_2d8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&index._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                    *)local_2f8,local_1f8,local_228,(string *)local_158,(size_t)beforeInclude.Value)
        ;
        std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
        operator=((vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                   *)local_338,&local_350);
        std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
        ~vector(&local_350);
      }
      __end2_1 = std::
                 vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                 ::begin((vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                          *)local_338);
      file = (UnitySource *)
             std::
             vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
             end((vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                  *)local_338);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<cmLocalGenerator::UnitySource_*,_std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>_>
                                 *)&file), bVar4) {
        unity = (cmSourceFile *)
                __gnu_cxx::
                __normal_iterator<cmLocalGenerator::UnitySource_*,_std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>_>
                ::operator*(&__end2_1);
        this_01 = GetMakefile(this);
        local_430 = cmMakefile::GetOrCreateSource(this_01,(string *)unity,false,Ambiguous);
        cmGeneratorTarget::AddSource(local_18,(string *)unity,true);
        pcVar1 = local_430;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_450,"SKIP_UNITY_BUILD_INCLUSION",&local_451);
        cmSourceFile::SetProperty(pcVar1,&local_450,"ON");
        std::__cxx11::string::~string((string *)&local_450);
        std::allocator<char>::~allocator(&local_451);
        pcVar1 = local_430;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_478,"UNITY_SOURCE_FILE",&local_479);
        cmSourceFile::SetProperty(pcVar1,&local_478,(string *)unity);
        std::__cxx11::string::~string((string *)&local_478);
        std::allocator<char>::~allocator(&local_479);
        pcVar1 = local_430;
        if (((unity->Location).Directory.field_2._M_local_buf[0] & 1U) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4a0,"COMPILE_DEFINITIONS",&local_4a1);
          cmSourceFile::SetProperty(pcVar1,&local_4a0,"CMAKE_UNITY_CONFIG_$<UPPER_CASE:$<CONFIG>>");
          std::__cxx11::string::~string((string *)&local_4a0);
          std::allocator<char>::~allocator(&local_4a1);
        }
        __gnu_cxx::
        __normal_iterator<cmLocalGenerator::UnitySource_*,_std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>_>
        ::operator++(&__end2_1);
      }
      std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
      ~vector((vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
               *)local_338);
      std::
      vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
      ::~vector((vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                 *)local_2f8);
      std::__cxx11::string::~string((string *)local_2d8);
    }
    std::__cxx11::string::~string((string *)local_158);
    std::
    map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
    ::~map((map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
            *)&ci);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&index._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
    ::~vector((vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
               *)&configs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddUnityBuild(cmGeneratorTarget* target)
{
  if (!target->GetPropertyAsBool("UNITY_BUILD")) {
    return;
  }

  std::vector<UnityBatchedSource> unitySources;

  std::vector<std::string> configs =
    this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  std::map<cmSourceFile const*, size_t> index;

  for (size_t ci = 0; ci < configs.size(); ++ci) {
    // FIXME: Refactor collection of sources to not evaluate object libraries.
    std::vector<cmSourceFile*> sources;
    target->GetSourceFiles(sources, configs[ci]);
    for (cmSourceFile* sf : sources) {
      auto mi = index.find(sf);
      if (mi == index.end()) {
        unitySources.emplace_back(sf);
        std::map<cmSourceFile const*, size_t>::value_type entry(
          sf, unitySources.size() - 1);
        mi = index.insert(entry).first;
      }
      unitySources[mi->second].Configs.emplace_back(ci);
    }
  }

  std::string filename_base =
    cmStrCat(this->GetCurrentBinaryDirectory(), "/CMakeFiles/",
             target->GetName(), ".dir/Unity/");

  cmValue batchSizeString = target->GetProperty("UNITY_BUILD_BATCH_SIZE");
  const size_t unityBatchSize = batchSizeString
    ? static_cast<size_t>(std::atoi(batchSizeString->c_str()))
    : 0;

  cmValue beforeInclude =
    target->GetProperty("UNITY_BUILD_CODE_BEFORE_INCLUDE");
  cmValue afterInclude = target->GetProperty("UNITY_BUILD_CODE_AFTER_INCLUDE");
  cmValue unityMode = target->GetProperty("UNITY_BUILD_MODE");

  for (std::string lang : { "C", "CXX" }) {
    std::vector<UnityBatchedSource> filtered_sources;
    std::copy_if(unitySources.begin(), unitySources.end(),
                 std::back_inserter(filtered_sources),
                 [&](UnityBatchedSource const& ubs) -> bool {
                   cmSourceFile* sf = ubs.Source;
                   return sf->GetLanguage() == lang &&
                     !sf->GetPropertyAsBool("SKIP_UNITY_BUILD_INCLUSION") &&
                     !sf->GetPropertyAsBool("HEADER_FILE_ONLY") &&
                     !sf->GetProperty("COMPILE_OPTIONS") &&
                     !sf->GetProperty("COMPILE_DEFINITIONS") &&
                     !sf->GetProperty("COMPILE_FLAGS") &&
                     !sf->GetProperty("INCLUDE_DIRECTORIES");
                 });

    std::vector<UnitySource> unity_files;
    if (!unityMode || *unityMode == "BATCH") {
      unity_files = AddUnityFilesModeAuto(
        target, lang, configs, filtered_sources, beforeInclude, afterInclude,
        filename_base, unityBatchSize);
    } else if (unityMode && *unityMode == "GROUP") {
      unity_files =
        AddUnityFilesModeGroup(target, lang, configs, filtered_sources,
                               beforeInclude, afterInclude, filename_base);
    } else {
      // unity mode is set to an unsupported value
      std::string e("Invalid UNITY_BUILD_MODE value of " + *unityMode +
                    " assigned to target " + target->GetName() +
                    ". Acceptable values are BATCH and GROUP.");
      this->IssueMessage(MessageType::FATAL_ERROR, e);
    }

    for (UnitySource const& file : unity_files) {
      auto* unity = this->GetMakefile()->GetOrCreateSource(file.Path);
      target->AddSource(file.Path, true);
      unity->SetProperty("SKIP_UNITY_BUILD_INCLUSION", "ON");
      unity->SetProperty("UNITY_SOURCE_FILE", file.Path);
      if (file.PerConfig) {
        unity->SetProperty("COMPILE_DEFINITIONS",
                           "CMAKE_UNITY_CONFIG_$<UPPER_CASE:$<CONFIG>>");
      }
    }
  }
}